

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_int16 *
drwav_open_file_and_read_pcm_frames_s16
          (char *filename,uint *channelsOut,uint *sampleRateOut,drwav_uint64 *totalFrameCountOut,
          drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_bool32 dVar1;
  drwav_int16 *pdVar2;
  drwav wav;
  drwav local_1d0;
  
  if (channelsOut != (uint *)0x0) {
    *channelsOut = 0;
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = 0;
  }
  if (totalFrameCountOut != (drwav_uint64 *)0x0) {
    *totalFrameCountOut = 0;
  }
  dVar1 = drwav_init_file(&local_1d0,filename,pAllocationCallbacks);
  if (dVar1 == 0) {
    pdVar2 = (drwav_int16 *)0x0;
  }
  else {
    pdVar2 = drwav__read_pcm_frames_and_close_s16
                       (&local_1d0,channelsOut,sampleRateOut,totalFrameCountOut);
  }
  return pdVar2;
}

Assistant:

DRWAV_API drwav_int16* drwav_open_file_and_read_pcm_frames_s16(const char* filename, unsigned int* channelsOut, unsigned int* sampleRateOut, drwav_uint64* totalFrameCountOut, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    drwav wav;

    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }

    if (!drwav_init_file(&wav, filename, pAllocationCallbacks)) {
        return NULL;
    }

    return drwav__read_pcm_frames_and_close_s16(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}